

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::maybe_send_request
          (ut_metadata_peer_plugin *this)

{
  vector<metadata_piece> *this_00;
  ut_metadata_plugin *puVar1;
  pointer pmVar2;
  pointer pmVar3;
  char cVar4;
  int iVar5;
  time_point tVar6;
  pointer pmVar7;
  pointer pmVar8;
  pointer pmVar9;
  bool bVar10;
  int piece;
  undefined4 uStack_3c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar5 = (*(this->m_pc->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((char)iVar5 != '\0') {
    return;
  }
  if (0 < (((this->m_torrent->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    return;
  }
  if (this->m_message_index == 0) {
    return;
  }
  if (4 < (ulong)((long)(this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start)) {
    return;
  }
  if (((this->m_pc->super_peer_connection).field_0x887 & 8) == 0) {
    tVar6 = aux::time_now();
    if ((long)tVar6.__d.__r <= (this->m_request_limit).__d.__r) {
      return;
    }
    bVar10 = ((this->m_pc->super_peer_connection).field_0x887 & 8) == 0;
  }
  else {
    bVar10 = false;
  }
  puVar1 = this->m_tp;
  this_00 = &puVar1->m_requested_metadata;
  pmVar7 = (puVar1->m_requested_metadata).
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           .
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (puVar1->m_requested_metadata).
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           .
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pmVar3 = pmVar7;
  pmVar8 = pmVar7;
  if (pmVar7 == pmVar2) {
    aux::
    container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
    ::resize<int,void>((container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
                        *)this_00,1);
    pmVar7 = (this_00->
             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ).
             super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar9 = pmVar7;
  }
  else {
    while (pmVar9 = pmVar3, pmVar8 = pmVar8 + 1, pmVar8 != pmVar2) {
      pmVar3 = pmVar8;
      if (pmVar9->num_requests <= pmVar8->num_requests) {
        pmVar3 = pmVar9;
      }
    }
  }
  iVar5 = (int)((ulong)((long)pmVar9 - (long)pmVar7) >> 5);
  ::std::weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>::lock
            ((weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin> *)&piece);
  tVar6 = aux::time_now();
  pmVar7 = (this_00->
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ).
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (CONCAT44(uStack_3c,piece) != 0) {
    cVar4 = (**(code **)(**(long **)(CONCAT44(uStack_3c,piece) + 0x60) + 8))();
    pmVar7 = (this_00->
             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ).
             super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((cVar4 == '\0') && ((long)tVar6.__d.__r - (rep)pmVar7[iVar5].last_request.__d < 3000000000))
    {
      iVar5 = -1;
      goto LAB_0034a538;
    }
  }
  pmVar7[iVar5].num_requests = pmVar7[iVar5].num_requests + 1;
  if (!bVar10) {
    pmVar7[iVar5].last_request.__d = tVar6.__d.__r;
  }
LAB_0034a538:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  if (iVar5 != -1) {
    piece = iVar5;
    ::std::vector<int,_std::allocator<int>_>::push_back(&this->m_sent_requests,&piece);
    write_metadata_packet(this,request,piece);
  }
  return;
}

Assistant:

void maybe_send_request()
		{
			if (m_pc.is_disconnecting()) return;

			// if we don't have any metadata, and this peer
			// supports the request metadata extension
			// and we aren't currently waiting for a request
			// reply. Then, send a request for some metadata.
			if (!m_torrent.valid_metadata()
				&& m_message_index != 0
				&& m_sent_requests.size() < 2
				&& has_metadata())
			{
				int const piece = m_tp.metadata_request(m_pc.has_metadata());
				if (piece == -1) return;

				m_sent_requests.push_back(piece);
				write_metadata_packet(msg_t::request, piece);
			}
		}